

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawPlainRoundedRect
               (QPainter *p,int x,int y,int w,int h,qreal rx,qreal ry,QColor *c,int lineWidth,
               QBrush *fill)

{
  long in_FS_OFFSET;
  double dVar1;
  undefined1 auStack_a0 [4];
  int local_9c;
  qreal local_98;
  qreal local_90;
  double local_88;
  QBrush local_70 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  QPainterStateGuard local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      local_68._0_4_ = 2;
      local_58._4_4_ = 0;
      local_68._4_4_ = 0;
      uStack_60._0_4_ = 0;
      uStack_60._4_4_ = 0;
      local_58._0_4_ = 0;
      pcStack_50 = "default";
      QMessageLogger::warning((char *)&local_68,"qDrawPlainRect: Invalid parameters");
    }
    else {
      local_48.m_level = 0;
      local_48._12_4_ = 0xaaaaaaaa;
      local_9c = x;
      local_98 = rx;
      local_90 = ry;
      local_48.m_painter = p;
      QPainterStateGuard::save(&local_48);
      if (lineWidth != 0 || fill != (QBrush *)0x0) {
        local_88 = (double)lineWidth;
        if (0 < lineWidth) {
          QBrush::QBrush(local_70,(QColor *)c,SolidPattern);
          QPen::QPen((QPen *)&local_68,local_70,local_88,SolidLine,SquareCap,BevelJoin);
          QPainter::setPen((QPen *)p);
          QPen::~QPen((QPen *)&local_68);
          QBrush::~QBrush(local_70);
        }
        if (fill == (QBrush *)0x0) {
          QBrush::QBrush((QBrush *)&local_68,NoBrush);
        }
        else {
          QBrush::QBrush((QBrush *)&local_68,fill);
        }
        QPainter::setBrush((QBrush *)p);
        QBrush::~QBrush((QBrush *)&local_68);
        dVar1 = local_88 * 0.5;
        local_68 = (double)local_9c + dVar1;
        uStack_60 = (double)y + dVar1;
        local_58 = ((double)w - dVar1) - dVar1;
        pcStack_50 = (char *)(((double)h - dVar1) - dVar1);
        QPainter::drawRoundedRect((QRectF *)p,local_98,local_90,(int)auStack_a0 + 0x38);
      }
      QPainterStateGuard::~QPainterStateGuard(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawPlainRoundedRect(QPainter *p, int x, int y, int w, int h,
                           qreal rx, qreal ry, const QColor &c,
                           int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawPlainRect: Invalid parameters");
        return;
    }

    QPainterStateGuard painterGuard(p);
    if (lineWidth == 0 && !fill)
        return;
    if (lineWidth > 0)
        p->setPen(QPen(c, lineWidth));
    p->setBrush(fill ? *fill : Qt::NoBrush);
    const QRectF r(x, y, w, h);
    const auto lw2 = lineWidth / 2.;
    const QRectF rect = r.marginsRemoved(QMarginsF(lw2, lw2, lw2, lw2));
    p->drawRoundedRect(rect, rx, ry);
}